

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O2

void controlbits(uchar *out,uint32_t *pi)

{
  long lVar1;
  uchar c [5888];
  
  for (lVar1 = 0; lVar1 != 0x1700; lVar1 = lVar1 + 1) {
    c[lVar1] = '\0';
  }
  controlbitsfrompermutation(0xc,0x1000,1,0,c,pi);
  for (lVar1 = 0; lVar1 != 0x1700; lVar1 = lVar1 + 1) {
    out[lVar1] = c[lVar1];
  }
  return;
}

Assistant:

void controlbits(unsigned char * out, uint32_t * pi)
{
	unsigned int i;
	unsigned char c[ (2*GFBITS - 1) * (1 << GFBITS) / 16 ];

	for (i = 0; i < sizeof(c); i++)
		c[i] = 0;

	controlbitsfrompermutation(GFBITS, (1 << GFBITS), 1, 0, c, pi);

	for (i = 0; i < sizeof(c); i++)
		out[i] = c[i];
}